

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

Vector __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::measureDynamics
          (IMUElasticLocalFrameDynamicalSystem *this,Vector *x,Vector *u,uint k)

{
  uint uVar1;
  Matrix<double,_1,_1,0,_1,_1> *this_00;
  Matrix3 *pMVar2;
  DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *pDVar3;
  Scalar *dataPtr;
  Scalar *pSVar4;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar5;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  Scalar *scalar;
  StorageBaseType *matrix;
  undefined4 in_register_0000000c;
  Matrix<double,_3,_3,_0,_3,_3> *x_00;
  Index extraout_RDX;
  Index *pIVar6;
  uint in_R8D;
  double *pdVar7;
  double dVar8;
  Vector VVar9;
  undefined1 local_c38 [16];
  Type local_c28;
  Type local_bf8;
  Matrix<double,_3,_1,_0,_3,_1> *local_bc8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_bc0;
  Matrix<double,_3,_1,_0,_3,_1> *local_b98;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_b90;
  Scalar local_b80;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_b78;
  Matrix<double,_3,_3,_0,_3,_3> *local_b58;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_b50;
  Scalar local_b40;
  Scalar local_b38;
  Scalar local_b30;
  Scalar local_b28;
  Scalar local_b20;
  Scalar local_b18;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_b10;
  Type local_af0;
  Type local_ab8;
  uint local_a7c;
  undefined1 local_a78 [4];
  uint i_3;
  Type local_a48;
  Type local_a18;
  Stride<0,_0> local_9e2;
  Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_> local_9e0;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_9d0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_9c0;
  Matrix3 local_9a0;
  Matrix<double,_3,_3,_0,_3,_3> local_958;
  Matrix3 local_910;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_8c8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_8b0;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_890;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_868;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_858;
  Matrix3 local_838;
  int local_7ec;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
  local_7e8;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>
  local_7c0;
  Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_790;
  Type local_758;
  Type local_728;
  Type local_6f8;
  Type local_6c8;
  Type local_698;
  Type local_668;
  uint local_634;
  undefined1 auStack_630 [4];
  int i_2;
  Type local_620;
  Type local_5e8;
  Type local_5b0;
  Type local_578;
  Type local_540;
  Type local_508;
  Type local_4d8;
  Type local_4a8;
  Type local_478;
  Type local_448;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> local_418 [48]
  ;
  Matrix<double,__1,__1,_0,__1,__1> local_3e8;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> local_3c0 [48]
  ;
  Matrix<double,__1,__1,_0,__1,__1> local_390;
  uint local_378;
  uint local_374;
  uint i_1;
  uint nbContacts;
  Type local_328;
  Vector6 local_2f8;
  Matrix3 local_2c0;
  Type local_278;
  Vector6 local_248;
  Type local_218;
  Type local_1e8;
  Type local_1b0;
  Type local_178;
  uint local_13c;
  undefined1 local_138 [4];
  int i;
  Type local_100;
  Type local_c8;
  Type local_90;
  uint local_54;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pDStack_50;
  uint k_local;
  Vector *u_local;
  Vector *x_local;
  IMUElasticLocalFrameDynamicalSystem *this_local;
  
  pDStack_50 = (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               CONCAT44(in_register_0000000c,k);
  local_54 = in_R8D;
  u_local = u;
  x_local = x;
  this_local = this;
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_
            ((DynamicalSystemFunctorBase *)x,(Vector *)pDStack_50);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,u_local);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1c].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)pDStack_50);
  *(uint *)&x[0x6f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = local_54;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_90,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x4a),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_90);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_c8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_100,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_100);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)local_138,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,9,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x50),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )local_138);
  for (local_13c = 0; local_13c < 2; local_13c = local_13c + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_178,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,
               (ulong)(local_13c * 6 + 0xc),6);
    this_00 = (Matrix<double,_1,_1,0,_1,_1> *)
              IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),local_13c);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
              (this_00,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                        *)&local_178);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_1b0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x18,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0xcb),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_1b0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_1e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x1b,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_1e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_218,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,0x20,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_218);
  pMVar2 = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,
                            (Vector3 *)
                            &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,0);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,pMVar2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<6>(&local_278,pDStack_50,9,6);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,6,1,false>>
            ((Matrix<double,6,1,0,6,1> *)&local_248,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false>_> *)
             &local_278);
  kine::computeInertiaTensor(&local_2c0,&local_248,(Matrix3 *)(x + 0xb8));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<6>
            (&local_328,pDStack_50,0x12,6);
  Eigen::Matrix<double,6,1,0,6,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,6,1,false>>
            ((Matrix<double,6,1,0,6,1> *)&local_2f8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_6,_1,_false>_> *)
             &local_328);
  kine::computeInertiaTensor
            ((Matrix3 *)&i_1,&local_2f8,
             (Matrix3 *)
             &x[0xbc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  local_374 = getContactsNumber((IMUElasticLocalFrameDynamicalSystem *)x);
  for (local_378 = 0; local_378 < local_374; local_378 = local_378 + 1) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)local_3c0,pDStack_50,(ulong)(local_378 * 0xc + 0x30),3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_390,local_3c0);
    IndexedMatrixArray::setValue((IndexedMatrixArray *)(x + 0xa2),(Matrix *)&local_390,local_378);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_390);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)local_418,pDStack_50,(ulong)(local_378 * 0xc + 0x33),3);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_3e8,local_418);
    IndexedMatrixArray::setValue
              ((IndexedMatrixArray *)
               &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(Matrix *)&local_3e8,local_378);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_3e8);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_448,pDStack_50,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_448);
  if ((x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
      0x10000000000) != 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               &x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x53));
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_478,pDStack_50,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x90),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_478);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_4a8,pDStack_50,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_4a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>(&local_4d8,pDStack_50,0xf,3)
  ;
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x93),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_4d8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_508,pDStack_50,0x18,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_508);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_540,pDStack_50,0x1b,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x96),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_540);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_578,pDStack_50,0x21,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x97].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_578);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_5b0,pDStack_50,0x27,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x99),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_5b0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_5e8,pDStack_50,0x1e,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x9a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)&local_5e8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_620,pDStack_50,0x24,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x9c),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *
             )&local_620);
  pMVar2 = computeRotation_((IMUElasticLocalFrameDynamicalSystem *)x,
                            (Vector3 *)
                            &x[0x9a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,1);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
            ((Matrix<double,_3,_3,_0,_3,_3> *)
             &x[0x9d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,pMVar2);
  _auStack_630 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                            &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows,
                            (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            &x[0x9d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_rows);
  Eigen::Matrix<double,3,3,0,3,3>::operator=
            ((Matrix<double,3,3,0,3,3> *)(x + 0x86),
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)auStack_630);
  for (local_634 = 0; local_634 < 2; local_634 = local_634 + 1) {
    pDVar3 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),local_634);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>(&local_668,pDVar3,0,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_698,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)(int)(local_634 * 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_698,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               &local_668);
    pDVar3 = (DenseBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
             IndexedMatrixArray::operator[]((IndexedMatrixArray *)(x + 0xc1),local_634);
    Eigen::DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::block<3,1>(&local_6c8,pDVar3,3,0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_6f8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(long)(int)(local_634 * 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_6f8,
               (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_3,_1,_false>_> *)
               &local_6c8);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_728,pDStack_50,0x2a,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                      *)&local_728);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_758,pDStack_50,0x2d,3);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0xf2),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_758);
  (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data[10]
  )(x,&x[0x8e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0x90,&x[0x91].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,x + 0x93,
    &x[0x94].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0xb8,&x[0xbc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,x + 0xa2,
    &x[0xa7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0x4a,&x[0x4b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,x + 0xce,
    &x[0x4e].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0x50,&x[0xcf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,
    &x[0x14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    &x[0x15].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0xcb,&x[0xcc].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,
    &x[0xf0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
    x + 0xf2);
  local_7ec = 2;
  kine::skewSymmetric(&local_838,(Vector3 *)(x + 0x50));
  Eigen::operator*(&local_7e8,&local_7ec,(StorageBaseType *)&local_838);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_7c0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_7e8,
              (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
              &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(&local_790,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
               *)&local_7c0,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              &x[0x97].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)
             &x[0x8a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(DenseBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)&local_790);
  local_868 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                         &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x99));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_858,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)(x + 0xce),
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_868);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             &x[0x8a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_858);
  kine::skewSymmetric(&local_910,
                      (Vector3 *)
                      &x[0xcf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_rows);
  kine::skewSymmetric(&local_9a0,(Vector3 *)(x + 0x50));
  tools::square<Eigen::Matrix<double,3,3,0,3,3>>(&local_958,(tools *)&local_9a0,x_00);
  Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
            (&local_8c8,(MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_910,
             (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&local_958);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_8b0,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_8c8,
              (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
              &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*(&local_890,
              (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
               *)&local_8b0,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x96));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
             &x[0x8a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(MatrixBase<Eigen::Product<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                      *)&local_890);
  local_9d0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                         &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                          m_storage.m_rows,
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x9c));
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (&local_9c0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)(x + 0x50),
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_9d0);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)(x + 0x8c),
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
              *)&local_9c0);
  uVar1 = AlgebraicSensor::getStateSize((AlgebraicSensor *)(x + 1));
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(ulong)uVar1);
  dataPtr = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)(x + 0x86),0,0);
  Eigen::Stride<0,_0>::Stride(&local_9e2);
  Eigen::Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_>::Map
            (&local_9e0,dataPtr,&local_9e2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<9>
            (&local_a18,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,9);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,9,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,9,1,false> *)&local_a18,
             (DenseBase<Eigen::Map<Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)&local_9e0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_a48,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,9,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_a48,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             &x[0x8a].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)local_a78,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
             &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,0xc,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)local_a78,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x8c));
  *(undefined4 *)
   &x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0xf;
  if ((x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
      0x100000000) != 0) {
    for (local_a7c = 0;
        local_a7c <
        *(uint *)((long)&x[0x13].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows + 4); local_a7c = local_a7c + 1) {
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                (&local_ab8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u_local,
                 (ulong)(local_a7c * 6 + 0xc),6);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
                (&local_af0,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows,(ulong)*(uint *)&x[0x46].
                                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                          .m_storage.m_data,6);
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
                ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_af0,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_ab8);
      *(int *)&x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data =
           *(int *)&x[0x46].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                    .m_data + 6;
    }
  }
  if ((x[0x43].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows &
      0x1000000000000) != 0) {
    pIVar6 = &x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pIVar6,2);
    pdVar7 = (double *)cos(*pSVar4);
    x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar7
    ;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pIVar6,2);
    dVar8 = sin(*pSVar4);
    x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)dVar8;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator<<
              (&local_b10,
               (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
               &x[0x60].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(Scalar *)(x + 0x65));
    local_b18 = -(double)x[0x65].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (&local_b10,&local_b18);
    local_b20 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_b20);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)
                               &x[0x65].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                m_storage.m_rows);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,(Scalar *)(x + 0x65));
    local_b28 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_b28);
    local_b30 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_b30);
    local_b38 = 0.0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar5,&local_b38);
    local_b40 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar5,&local_b40);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::~CommaInitializer(&local_b10);
    local_b50 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                           &x[0x60].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows,
                           (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           &x[0x54].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    local_b58 = (Matrix<double,_3,_3,_0,_3,_3> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                           &x[0x79].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    Eigen::NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,3,0,3,3>,Eigen::MatrixBase> *)&local_b58,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
                *)&local_b50);
    pIVar6 = &x[0x5d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pIVar6,0);
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_b78,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x7e),pSVar4);
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)pIVar6,1);
    this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        (&local_b78,pSVar4);
    local_b80 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this_01,&local_b80);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_b78);
    local_b90 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                           &x[0x60].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x4a));
    local_b98 = (Matrix<double,_3,_1,_0,_3,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x7e));
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_b98,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_b90);
    Eigen::AngleAxis<double>::operator=
              ((AngleAxis<double> *)
               &x[0x7f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                       &x[0x79].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_rows);
    scalar = Eigen::AngleAxis<double>::angle
                       ((AngleAxis<double> *)
                        &x[0x7f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    matrix = (StorageBaseType *)
             Eigen::AngleAxis<double>::axis
                       ((AngleAxis<double> *)
                        &x[0x7f].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows);
    Eigen::operator*(&local_bc0,scalar,matrix);
    local_bc8 = (Matrix<double,_3,_1,_0,_3,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           &x[0x81].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows);
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_bc8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_bc0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_bf8,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(ulong)*(uint *)&x[0x46].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_bf8,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)(x + 0x7e));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_c28,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
               &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows,(ulong)(*(int *)&x[0x46].
                                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                        .m_storage.m_data + 3),3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_c28,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               &x[0x81].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows);
  }
  AlgebraicSensor::setState
            ((AlgebraicSensor *)(x + 1),
             (Vector *)
             &x[0x8d].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,local_54);
  AlgebraicSensor::getMeasurements((AlgebraicSensor *)local_c38,(bool)((char)x + '\x10'));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows,(Matrix<double,__1,_1,_0,__1,_1> *)local_c38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c38);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,
             (Matrix<double,__1,_1,_0,__1,_1> *)
             &x[0x1b].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar9.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUElasticLocalFrameDynamicalSystem::measureDynamics
                (const Vector& x, const Vector& u, unsigned k)
    {
        assertStateVector_(x);
        assertInputVector_(u);

        xk_fory_=x;
        uk_fory_=u;
        op_.k_fory=k;

        op_.positionFlex=x.segment(state::pos,3);
        op_.velocityFlex=x.segment(state::linVel,3);
        op_.orientationFlexV=x.segment(state::ori,3);
        op_.angularVelocityFlex=x.segment(state::angVel,3);

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
            op_.efforts[i]=x.segment(state::fc+6*i,6);

        op_.fm=x.segment(state::unmodeledForces,3);
        op_.tm=x.segment(state::unmodeledForces+3,3);
        op_.drift=x.segment<3>(state::drift);

        op_.rFlex =computeRotation_(op_.orientationFlexV,0);

        kine::computeInertiaTensor(u.segment<6>(input::inertia),op_.inertia);
        kine::computeInertiaTensor(u.segment<6>(input::dotInertia),op_.dotInertia);
        unsigned nbContacts(getContactsNumber());
        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            // Positions
            op_.contactPosV.setValue(u.segment<3>(input::contacts + 12*i),i);
            op_.contactOriV.setValue(u.segment<3>(input::contacts +12*i+3),i);
        }
        op_.positionCom=u.segment<3>(input::posCom);
        if(withComBias_) op_.positionCom-=op_.positionComBias;
        op_.velocityCom=u.segment<3>(input::velCom);
        op_.accelerationCom=u.segment<3>(input::accCom);
        op_.AngMomentum=u.segment<3>(input::angMoment);
        op_.dotAngMomentum=u.segment<3>(input::dotAngMoment);

        op_.positionControl=u.segment(input::posIMU,3);
        op_.velocityControl=u.segment(input::linVelIMU,3);
        op_.accelerationControl=u.segment(input::linAccIMU,3);
        op_.orientationControlV=u.segment(input::oriIMU,3);
        op_.angularVelocityControl=u.segment(input::angVelIMU,3);

        op_.rControl=computeRotation_(op_.orientationControlV,1);

        op_.rimu = op_.rFlex * op_.rControl;

        for (int i=0; i<hrp2::contact::nbModeledMax; ++i)
        {
            fc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(0,0);
            tc_.segment<3>(3*i) = op_.efforts[i].block<3,1>(3,0);
        }

        op_.addForce = u.segment<3>(input::additionalForces);
        op_.addMoment = u.segment<3>(input::additionalForces+3);

        // Get acceleration
        computeAccelerations (op_.positionCom, op_.velocityCom,
                  op_.accelerationCom, op_.AngMomentum, op_.dotAngMomentum,
                  op_.inertia, op_.dotInertia,  op_.contactPosV, op_.contactOriV,
                  op_.positionFlex, op_.velocityFlex, op_.linearAcceleration,
                  op_.orientationFlexV, op_.rFlex, op_.angularVelocityFlex,
                  op_.angularAcceleration, fc_, tc_, op_.fm,op_.tm,
                  op_.addForce,op_.addMoment);

        // Translation sensor dynamic
        op_.imuAcc = 2*kine::skewSymmetric(op_.angularVelocityFlex) * op_.rFlex * op_.velocityControl;
        op_.imuAcc += op_.linearAcceleration + op_.rFlex * op_.accelerationControl;
        op_.imuAcc += (
                    kine::skewSymmetric(op_.angularAcceleration)
                    + tools::square(kine::skewSymmetric(op_.angularVelocityFlex))
                )*op_.rFlex * op_.positionControl;

        // Rotation sensor dynamic
        op_.imuOmega = op_.angularVelocityFlex + op_.rFlex * op_.angularVelocityControl;

        // Set sensor state before measurement

        op_.sensorState.resize(sensor_.getStateSize());
        op_.sensorState.head<9>() = Eigen::Map<Eigen::Matrix<double, 9, 1> >(&op_.rimu(0,0));
        op_.sensorState.segment<3>(9)=op_.imuAcc;
        op_.sensorState.segment<3>(12)=op_.imuOmega;

        index_=15;

        if (withForceMeasurements_)
        {
          for (unsigned int i=0; i<nbContacts_; ++i)
          {
            op_.sensorState.segment(index_,6) = x.segment(state::fc+i*6,6);
            // the last part of the measurement is force torque, it is
            // computes by the current functor and not the sensor_.
            // (see AlgebraicSensor::concatenateWithInput
            // for more details
            index_+=6;
          }
        }

        if (withAbsolutePos_)
        {
          op_.cy=cos(op_.drift(2));
          op_.sy=sin(op_.drift(2));
          op_.rdrift<< op_.cy, -op_.sy, 0,
                       op_.sy,  op_.cy, 0,
                       0,       0,      1;
          op_.rtotal.noalias() = op_.rdrift*op_.rFlex;

          op_.ptotal << op_.drift(0),op_.drift(1),0;
          op_.ptotal.noalias() += op_.rdrift*op_.positionFlex;

          op_.aatotal = op_.rtotal;
          op_.oritotal.noalias() = op_.aatotal.angle()*op_.aatotal.axis();

          op_.sensorState.segment<3>(index_) = op_.ptotal;
          op_.sensorState.segment<3>(index_+3) = op_.oritotal;
        }

        sensor_.setState(op_.sensorState,k);

        //measurements
        yk_=sensor_.getMeasurements();
        return yk_;
    }